

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::BlockingStrategy::WaitFor<long,std::ratio<1l,1l>>
          (BlockingStrategy *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  int64_t iVar1;
  function<bool_(std::unique_lock<std::mutex>_&)> *in_RCX;
  anon_class_16_2_7fda700e *in_RDX;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_RDI;
  undefined8 *in_R9;
  Waiter *in_stack_ffffffffffffff90;
  atomic<bool> *in_stack_ffffffffffffff98;
  Sequence *cursor_00;
  int64_t *in_stack_ffffffffffffffb0;
  BlockingStrategy *in_stack_ffffffffffffffb8;
  
  cursor_00 = (Sequence *)*in_R9;
  std::function<bool(std::unique_lock<std::mutex>&)>::
  function<disruptor::BlockingStrategy::WaitFor<long,std::ratio<1l,1l>>(long_const&,disruptor::Sequence_const&,std::vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>>const&,std::atomic<bool>const&,std::chrono::duration<long,std::ratio<1l,1l>>const&)::_lambda(std::unique_lock<std::mutex>&)_1_,void>
            (in_RCX,in_RDX);
  iVar1 = WaitFor(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,cursor_00,in_RDI,
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::function<bool_(std::unique_lock<std::mutex>_&)>::~function
            ((function<bool_(std::unique_lock<std::mutex>_&)> *)0x13107d);
  return iVar1;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<Rep, Period>& timeout) {
    return WaitFor(sequence, cursor, dependents, alerted,
                   [this, timeout](Lock& lock) {
                     return std::cv_status::timeout ==
                            consumer_notify_condition_.wait_for(
                                lock, std::chrono::microseconds(timeout));
                   });
  }